

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int av1_fp_compute_num_enc_workers(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int col;
  int col_00;
  int row;
  TileInfo tile_info;
  
  if ((cpi->oxcf).max_threads < 2) {
    iVar5 = 1;
  }
  else {
    iVar1 = (cpi->common).tiles.cols;
    iVar4 = (cpi->common).tiles.rows;
    row = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    iVar5 = 0;
    for (; row != iVar4; row = row + 1) {
      for (col_00 = 0; iVar1 != col_00; col_00 = col_00 + 1) {
        av1_tile_init(&tile_info,&cpi->common,row,col_00);
        iVar2 = av1_get_unit_rows_in_tile(&tile_info,cpi->fp_block_size);
        iVar3 = av1_get_unit_cols_in_tile(&tile_info,cpi->fp_block_size);
        iVar3 = iVar3 + 1 >> 1;
        if (iVar2 <= iVar3) {
          iVar3 = iVar2;
        }
        iVar5 = iVar5 + iVar3;
      }
    }
    iVar1 = (cpi->oxcf).max_threads;
    if (iVar1 < iVar5) {
      iVar5 = iVar1;
    }
  }
  return iVar5;
}

Assistant:

int av1_fp_compute_num_enc_workers(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int total_num_threads_row_mt = 0;
  TileInfo tile_info;

  if (cpi->oxcf.max_threads <= 1) return 1;

  for (int row = 0; row < tile_rows; row++) {
    for (int col = 0; col < tile_cols; col++) {
      av1_tile_init(&tile_info, cm, row, col);
      const int num_mb_rows_in_tile =
          av1_get_unit_rows_in_tile(&tile_info, cpi->fp_block_size);
      const int num_mb_cols_in_tile =
          av1_get_unit_cols_in_tile(&tile_info, cpi->fp_block_size);
      total_num_threads_row_mt +=
          AOMMIN((num_mb_cols_in_tile + 1) >> 1, num_mb_rows_in_tile);
    }
  }
  return AOMMIN(cpi->oxcf.max_threads, total_num_threads_row_mt);
}